

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddAbs.c
# Opt level: O0

DdNode * Cudd_bddBooleanDiff(DdManager *manager,DdNode *f,int x)

{
  DdNode *var_00;
  DdNode *var;
  DdNode *res;
  int x_local;
  DdNode *f_local;
  DdManager *manager_local;
  
  if (x < manager->size) {
    var_00 = manager->vars[x];
    do {
      manager->reordered = 0;
      manager_local =
           (DdManager *)
           cuddBddBooleanDiffRecur(manager,(DdNode *)((ulong)f & 0xfffffffffffffffe),var_00);
    } while (manager->reordered == 1);
  }
  else {
    manager_local = (DdManager *)((ulong)manager->one ^ 1);
  }
  return &manager_local->sentinel;
}

Assistant:

DdNode *
Cudd_bddBooleanDiff(
  DdManager * manager,
  DdNode * f,
  int  x)
{
    DdNode *res, *var;

    /* If the variable is not currently in the manager, f cannot
    ** depend on it.
    */
    if (x >= manager->size) return(Cudd_Not(DD_ONE(manager)));
    var = manager->vars[x];

    do {
        manager->reordered = 0;
        res = cuddBddBooleanDiffRecur(manager, Cudd_Regular(f), var);
    } while (manager->reordered == 1);

    return(res);

}